

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

int curlTimerCallback(CURLM *multi,long timeout_ms,void *userp)

{
  __time_t _Var1;
  timeval tVar2;
  
  if (timeout_ms == -1) {
    _Var1 = -1;
  }
  else {
    tVar2 = tutil_tvnow();
    _Var1 = tVar2.tv_sec;
    *(long *)((long)userp + 8) = timeout_ms * 1000 + tVar2.tv_usec;
  }
  *(__time_t *)userp = _Var1;
  return 0;
}

Assistant:

static int curlTimerCallback(CURLM *multi, long timeout_ms, void *userp)
{
  struct timeval* timeout = userp;

  (void)multi; /* unused */
  if(timeout_ms != -1) {
    *timeout = tutil_tvnow();
    timeout->tv_usec += timeout_ms * 1000;
  }
  else {
    timeout->tv_sec = -1;
  }
  return 0;
}